

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# error_info_fwd.hpp
# Opt level: O3

error_info * __thiscall
toml::make_error_info<toml::source_location,char_const(&)[14]>
          (error_info *__return_storage_ptr__,toml *this,string *title,source_location *loc,
          string *msg,source_location *tail,char (*tail_1) [14])

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_t *psVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  size_t sVar4;
  error_info ei;
  string local_258;
  string local_238;
  string local_218;
  undefined1 local_1f8 [56];
  _Alloc_hider local_1c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1b0;
  string local_1a0;
  error_info local_180;
  pointer local_128;
  size_type sStack_120;
  size_type local_118;
  size_t sStack_110;
  pointer local_108;
  size_type sStack_100;
  size_type local_f8;
  size_t sStack_f0;
  _Alloc_hider local_e8;
  size_type local_e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_d8;
  pointer local_c8;
  pointer pbStack_c0;
  pointer local_b8;
  pointer local_a8;
  size_type sStack_a0;
  undefined4 local_98;
  undefined4 uStack_94;
  undefined4 uStack_90;
  undefined4 uStack_8c;
  undefined4 local_88;
  undefined4 uStack_84;
  undefined4 uStack_80;
  undefined4 uStack_7c;
  undefined4 local_78;
  undefined4 uStack_74;
  undefined4 uStack_70;
  undefined4 uStack_6c;
  _Alloc_hider local_68;
  size_type local_60;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_58;
  pointer local_48;
  pointer pbStack_40;
  pointer local_38;
  
  paVar1 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)(this + 0x10);
  if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)this == paVar1) {
    local_238.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_238.field_2._8_8_ = *(undefined8 *)(this + 0x18);
    local_238._M_dataplus._M_p = (pointer)&local_238.field_2;
  }
  else {
    local_238.field_2._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_238._M_dataplus._M_p =
         (pointer)*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)this;
  }
  local_238._M_string_length = *(size_type *)(this + 8);
  *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
    **)this = paVar1;
  *(undefined8 *)(this + 8) = 0;
  this[0x10] = (toml)0x0;
  local_a8 = (title->_M_dataplus)._M_p;
  sStack_a0 = title->_M_string_length;
  local_98 = *(undefined4 *)&title->field_2;
  uStack_94 = *(undefined4 *)((long)&title->field_2 + 4);
  uStack_90 = *(undefined4 *)((long)&title->field_2 + 8);
  uStack_8c = *(undefined4 *)((long)&title->field_2 + 0xc);
  local_88 = *(undefined4 *)&title[1]._M_dataplus._M_p;
  uStack_84 = *(undefined4 *)((long)&title[1]._M_dataplus._M_p + 4);
  uStack_80 = (undefined4)title[1]._M_string_length;
  uStack_7c = *(undefined4 *)((long)&title[1]._M_string_length + 4);
  local_78 = *(undefined4 *)&title[1].field_2;
  uStack_74 = *(undefined4 *)((long)&title[1].field_2 + 4);
  uStack_70 = *(undefined4 *)((long)&title[1].field_2 + 8);
  uStack_6c = *(undefined4 *)((long)&title[1].field_2 + 0xc);
  local_68._M_p = (pointer)&local_58;
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)title[2]._M_dataplus._M_p;
  paVar1 = &title[2].field_2;
  if (paVar3 == paVar1) {
    local_58._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_58._8_8_ = *(undefined8 *)((long)&title[2].field_2 + 8);
  }
  else {
    local_58._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_68._M_p = (pointer)paVar3;
  }
  local_60 = title[2]._M_string_length;
  title[2]._M_dataplus._M_p = (pointer)paVar1;
  title[2]._M_string_length = 0;
  title[2].field_2._M_local_buf[0] = '\0';
  local_48 = (pointer)title[3]._M_dataplus._M_p;
  pbStack_40 = (pointer)title[3]._M_string_length;
  local_38 = (pointer)title[3].field_2._M_allocated_capacity;
  title[3].field_2._M_allocated_capacity = 0;
  title[3]._M_dataplus._M_p = (pointer)0x0;
  title[3]._M_string_length = 0;
  psVar2 = &loc->first_column_;
  if (*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
        **)loc ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar2) {
    local_258.field_2._M_allocated_capacity = *psVar2;
    local_258.field_2._8_4_ = (undefined4)loc->first_offset_;
    local_258.field_2._12_4_ = *(undefined4 *)((long)&loc->first_offset_ + 4);
    local_258._M_dataplus._M_p = (pointer)&local_258.field_2;
  }
  else {
    local_258.field_2._M_allocated_capacity = *psVar2;
    local_258._M_dataplus._M_p =
         (pointer)*(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                    **)loc;
  }
  local_258._M_string_length = loc->first_line_;
  *(size_t **)loc = psVar2;
  loc->first_line_ = 0;
  *(undefined1 *)&loc->first_column_ = 0;
  local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_218,"");
  error_info::error_info(&local_180,&local_238,(source_location *)&local_a8,&local_258,&local_218);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_218._M_dataplus._M_p != &local_218.field_2) {
    operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_258._M_dataplus._M_p != &local_258.field_2) {
    operator_delete(local_258._M_dataplus._M_p,local_258.field_2._M_allocated_capacity + 1);
  }
  source_location::~source_location((source_location *)&local_a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_238._M_dataplus._M_p != &local_238.field_2) {
    operator_delete(local_238._M_dataplus._M_p,local_238.field_2._M_allocated_capacity + 1);
  }
  local_1f8._0_8_ = local_1f8 + 0x10;
  std::__cxx11::string::_M_construct<char*>
            ((string *)local_1f8,local_180.title_._M_dataplus._M_p,
             local_180.title_._M_dataplus._M_p + local_180.title_._M_string_length);
  std::
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)(local_1f8 + 0x20),&local_180.locations_);
  local_1c0._M_p = (pointer)&local_1b0;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_1c0,local_180.suffix_._M_dataplus._M_p,
             local_180.suffix_._M_dataplus._M_p + local_180.suffix_._M_string_length);
  local_128 = (msg->_M_dataplus)._M_p;
  sStack_120 = msg->_M_string_length;
  local_118 = (msg->field_2)._M_allocated_capacity;
  sStack_110 = *(size_t *)((long)&msg->field_2 + 8);
  local_108 = msg[1]._M_dataplus._M_p;
  sStack_100 = msg[1]._M_string_length;
  local_f8 = msg[1].field_2._M_allocated_capacity;
  sStack_f0 = *(size_t *)((long)&msg[1].field_2 + 8);
  local_e8._M_p = (pointer)&local_d8;
  paVar3 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
            *)msg[2]._M_dataplus._M_p;
  paVar1 = &msg[2].field_2;
  if (paVar3 == paVar1) {
    local_d8._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_d8._8_8_ = *(undefined8 *)((long)&msg[2].field_2 + 8);
  }
  else {
    local_d8._M_allocated_capacity = paVar1->_M_allocated_capacity;
    local_e8._M_p = (pointer)paVar3;
  }
  local_e0 = msg[2]._M_string_length;
  msg[2]._M_dataplus._M_p = (pointer)paVar1;
  msg[2]._M_string_length = 0;
  msg[2].field_2._M_local_buf[0] = '\0';
  local_c8 = (pointer)msg[3]._M_dataplus._M_p;
  pbStack_c0 = (pointer)msg[3]._M_string_length;
  local_b8 = (pointer)msg[3].field_2._M_allocated_capacity;
  msg[3].field_2._M_allocated_capacity = 0;
  msg[3]._M_dataplus._M_p = (pointer)0x0;
  msg[3]._M_string_length = 0;
  local_1a0._M_dataplus._M_p = (pointer)&local_1a0.field_2;
  sVar4 = strlen(&tail->is_ok_);
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_1a0,tail,&tail->is_ok_ + sVar4);
  detail::make_error_info_rec<>
            (__return_storage_ptr__,(error_info *)local_1f8,(source_location *)&local_128,&local_1a0
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a0._M_dataplus._M_p != &local_1a0.field_2) {
    operator_delete(local_1a0._M_dataplus._M_p,local_1a0.field_2._M_allocated_capacity + 1);
  }
  source_location::~source_location((source_location *)&local_128);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_p != &local_1b0) {
    operator_delete(local_1c0._M_p,local_1b0._M_allocated_capacity + 1);
  }
  std::
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             *)(local_1f8 + 0x20));
  if ((undefined1 *)local_1f8._0_8_ != local_1f8 + 0x10) {
    operator_delete((void *)local_1f8._0_8_,local_1f8._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.suffix_._M_dataplus._M_p != &local_180.suffix_.field_2) {
    operator_delete(local_180.suffix_._M_dataplus._M_p,
                    local_180.suffix_.field_2._M_allocated_capacity + 1);
  }
  std::
  vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~vector(&local_180.locations_);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_180.title_._M_dataplus._M_p != &local_180.title_.field_2) {
    operator_delete(local_180.title_._M_dataplus._M_p,
                    local_180.title_.field_2._M_allocated_capacity + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

error_info make_error_info(
    std::string title, source_location loc, std::string msg, Ts&& ... tail)
{
    error_info ei(std::move(title), std::move(loc), std::move(msg));
    return detail::make_error_info_rec(ei, std::forward<Ts>(tail) ... );
}